

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

void add_pax_attr(archive_string *as,char *key,char *value)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  char *p;
  uint uVar9;
  char tmp [13];
  char local_23 [3];
  
  sVar3 = strlen(key);
  sVar4 = strlen(value);
  uVar5 = (int)sVar3 + (int)sVar4 + 3;
  if ((int)uVar5 < 1) {
    iVar7 = 1;
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    iVar7 = 1;
    uVar9 = uVar5;
    do {
      iVar2 = iVar2 + 1;
      iVar7 = iVar7 * 10;
      bVar1 = 9 < uVar9;
      uVar9 = uVar9 / 10;
    } while (bVar1);
  }
  local_23[2] = 0;
  uVar9 = (uint)(iVar7 <= (int)(iVar2 + uVar5)) + iVar2 + uVar5;
  uVar5 = -uVar9;
  if (0 < (int)uVar9) {
    uVar5 = uVar9;
  }
  uVar6 = (ulong)uVar5;
  pcVar8 = local_23 + 1;
  do {
    p = pcVar8;
    *p = "0123456789"[uVar6 % 10];
    pcVar8 = p + -1;
    bVar1 = 9 < uVar6;
    uVar6 = uVar6 / 10;
  } while (bVar1);
  if ((int)uVar9 < 0) {
    *pcVar8 = '-';
    p = pcVar8;
  }
  archive_strcat(as,p);
  archive_strappend_char(as,' ');
  archive_strcat(as,key);
  archive_strappend_char(as,'=');
  archive_strcat(as,value);
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
add_pax_attr(struct archive_string *as, const char *key, const char *value)
{
	int digits, i, len, next_ten;
	char tmp[1 + 3 * sizeof(int)];	/* < 3 base-10 digits per byte */

	/*-
	 * PAX attributes have the following layout:
	 *     <len> <space> <key> <=> <value> <nl>
	 */
	len = 1 + (int)strlen(key) + 1 + (int)strlen(value) + 1;

	/*
	 * The <len> field includes the length of the <len> field, so
	 * computing the correct length is tricky.  I start by
	 * counting the number of base-10 digits in 'len' and
	 * computing the next higher power of 10.
	 */
	next_ten = 1;
	digits = 0;
	i = len;
	while (i > 0) {
		i = i / 10;
		digits++;
		next_ten = next_ten * 10;
	}
	/*
	 * For example, if string without the length field is 99
	 * chars, then adding the 2 digit length "99" will force the
	 * total length past 100, requiring an extra digit.  The next
	 * statement adjusts for this effect.
	 */
	if (len + digits >= next_ten)
		digits++;

	/* Now, we have the right length so we can build the line. */
	tmp[sizeof(tmp) - 1] = 0;	/* Null-terminate the work area. */
	archive_strcat(as, format_int(tmp + sizeof(tmp) - 1, len + digits));
	archive_strappend_char(as, ' ');
	archive_strcat(as, key);
	archive_strappend_char(as, '=');
	archive_strcat(as, value);
	archive_strappend_char(as, '\n');
}